

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong
helper_extr_r_w_mips64el(target_ulong ac,target_ulong shift,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  
  uVar5 = (env->active_tc).HI[(int)ac] << 0x20;
  uVar2 = (uint)(env->active_tc).LO[(int)ac] | uVar5;
  uVar3 = (long)uVar2 >> (((byte)shift & 0x1f) - 1 & 0x3f);
  if ((shift & 0x1f) == 0) {
    uVar3 = uVar2 * 2;
  }
  if (((long)uVar5 < 0) || (uVar3 >> 0x20 != 0)) {
    if ((-1 < (long)uVar5) || (uVar3 < 0xffffffff00000000)) {
      pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
      *pbVar1 = *pbVar1 | 0x80;
    }
    bVar4 = (uVar3 == 0xffffffffffffffff) != (long)uVar5 < 0;
  }
  else {
    bVar4 = false;
  }
  uVar3 = uVar3 + 1;
  if (((bVar4) || (uVar3 >> 0x20 != 0)) && ((!bVar4 || (uVar3 < 0xffffffff00000000)))) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return (long)(int)(uVar3 >> 1);
}

Assistant:

target_ulong helper_extr_r_w(target_ulong ac, target_ulong shift,
                             CPUMIPSState *env)
{
    int64_t tempDL[2];

    shift = shift & 0x1F;

    mipsdsp_rndrashift_short_acc(tempDL, ac, shift, env);
    if ((tempDL[1] != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        (tempDL[1] != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    tempDL[0] += 1;
    if (tempDL[0] == 0) {
        tempDL[1] += 1;
    }

    if (((tempDL[1] & 0x01) != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        ((tempDL[1] & 0x01) != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)(int32_t)(tempDL[0] >> 1);
}